

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::cleanTrash(YdiskRestClient *this)

{
  Client *this_00;
  shared_ptr<httplib::Response> r;
  string url;
  undefined1 local_40 [16];
  Headers *local_30;
  
  std::__cxx11::string::string((string *)&local_30,"/v1/disk/trash/resources",(allocator *)local_40)
  ;
  this_00 = (Client *)local_40;
  httplib::Client::Delete(this_00,(char *)this->http_client,local_30);
  if ((Response *)local_40._0_8_ == (Response *)0x0) {
LAB_00156b0b:
    throw_response_error((YdiskRestClient *)this_00,(Response *)local_40._0_8_);
  }
  else if (*(int *)(local_40._0_8_ + 0x20) != 0xca) {
    if (*(int *)(local_40._0_8_ + 0x20) == 0xcc) goto LAB_00156b1c;
    goto LAB_00156b0b;
  }
  wait_success_operation(this,&((Response *)local_40._0_8_)->body);
LAB_00156b1c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void YdiskRestClient::cleanTrash()
{
    std::string url("/v1/disk/trash/resources");
    auto r = http_client->Delete(url.c_str(), headers);

    if(r.get() && r->status==204){
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is removing, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}